

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O1

bool tinyusdz::srgb_8bit_to_linear_8bit
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_img,size_t width,
               size_t height,size_t channels,size_t channel_stride,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *out_img,string *err)

{
  ostringstream oVar1;
  int iVar2;
  ostream *poVar3;
  pointer puVar4;
  long lVar5;
  size_t u;
  long lVar6;
  undefined8 unaff_RBP;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  pointer pcVar11;
  pointer pcVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  size_t dest_size;
  uint8_t linearlization_table [256];
  undefined1 local_210 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  pointer local_1e8;
  uint local_1dc;
  undefined1 local_1d8 [8];
  undefined8 *local_1d0;
  undefined8 local_1c0 [2];
  unsigned_long local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_210._0_8_ = channel_stride;
  local_1e8 = (pointer)channels;
  if (width == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
               ,0x54);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"srgb_8bit_to_linear_8bit",0x18);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x214);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar8 = "width is zero.";
    lVar6 = 0xe;
LAB_0046904a:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,lVar6);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,local_210._8_8_);
      if ((char *)local_210._8_8_ != local_200._M_local_buf + 8) {
LAB_00469099:
        operator_delete((void *)local_210._8_8_,local_200._8_8_ + 1);
      }
    }
  }
  else {
    if (height == 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"srgb_8bit_to_linear_8bit",0x18);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x218);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar8 = "height is zero.";
      lVar6 = 0xf;
      goto LAB_0046904a;
    }
    if (channels == 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"srgb_8bit_to_linear_8bit",0x18);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x21c);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar8 = "channels is zero.";
      lVar6 = 0x11;
      goto LAB_0046904a;
    }
    if (out_img == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"srgb_8bit_to_linear_8bit",0x18);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x220);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar8 = "`out_img` is nullptr.";
      lVar6 = 0x15;
      goto LAB_0046904a;
    }
    local_210._0_8_ = channels;
    if ((channel_stride == 0) || (local_210._0_8_ = channel_stride, channels <= channel_stride)) {
      local_1d8 = (undefined1  [8])(height * width * local_210._0_8_);
      puVar4 = (in_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish +
               -(long)(in_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
      bVar13 = (long)local_1d8 - (long)puVar4 == 0;
      uVar7 = CONCAT71((int7)((ulong)unaff_RBP >> 8),(ulong)local_1d8 < puVar4 || bVar13);
      if ((ulong)local_1d8 < puVar4 || bVar13) {
        local_1dc = (uint)uVar7;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)out_img,
                   (size_type)local_1d8);
        lVar6 = 0;
        do {
          fVar14 = (float)lVar6 / 255.0;
          fVar15 = 0.0;
          if ((0.0 < fVar14) && (fVar15 = 1.0, fVar14 < 1.0)) {
            if (0.04045 <= fVar14) {
              fVar15 = powf((fVar14 + 0.055) / 1.055,2.4);
            }
            else {
              fVar15 = fVar14 / 12.92;
            }
          }
          iVar2 = (int)(fVar15 * 255.0);
          if (0xfe < iVar2) {
            iVar2 = 0xff;
          }
          oVar1 = SUB41(iVar2,0);
          if (iVar2 < 1) {
            oVar1 = (ostringstream)0x0;
          }
          local_1a8[lVar6] = oVar1;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x100);
        lVar6 = 0;
        lVar5 = 0;
        uVar7 = (ulong)local_1dc;
        do {
          lVar10 = 0;
          lVar9 = lVar6;
          do {
            pcVar11 = local_1e8;
            if (local_1e8 != (pointer)0x0) {
              pcVar12 = (pointer)0x0;
              do {
                *(ostringstream *)
                 (pcVar12 +
                 (long)((out_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                        ._M_impl.super__Vector_impl_data._M_start + local_210._0_8_ * lVar9)) =
                     local_1a8[(byte)pcVar12[(long)((in_img->
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  local_210._0_8_ * lVar9)]];
                pcVar12 = pcVar12 + 1;
              } while (pcVar12 < local_1e8);
            }
            for (; pcVar11 < (ulong)local_210._0_8_; pcVar11 = pcVar11 + 1) {
              pcVar11[(long)((out_img->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start + local_210._0_8_ * lVar9)] =
                   pcVar11[(long)((in_img->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start +
                                 local_210._0_8_ * lVar9)];
            }
            lVar10 = lVar10 + 1;
            lVar9 = lVar9 + 1;
          } while (lVar10 != width + (width == 0));
          lVar5 = lVar5 + 1;
          lVar6 = lVar6 + width;
        } while (lVar5 != height + (height == 0));
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                   ,0x54);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"srgb_8bit_to_linear_8bit",0x18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x22d);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        local_1d0 = local_1c0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d0,
                   "Insufficient input buffer size. must be the same or larger than {} but has {}",
                   "");
        local_1b0 = (long)(in_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(in_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          )._M_impl.super__Vector_impl_data._M_start;
        fmt::format<unsigned_long,unsigned_long>
                  ((string *)(local_210 + 8),(fmt *)&local_1d0,(string *)local_1d8,&local_1b0,
                   (unsigned_long *)channel_stride);
        poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_210._8_8_,
                            local_200._M_allocated_capacity);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((char *)local_210._8_8_ != local_200._M_local_buf + 8) {
          operator_delete((void *)local_210._8_8_,local_200._8_8_ + 1);
        }
        if (local_1d0 != local_1c0) {
          operator_delete(local_1d0,local_1c0[0] + 1);
        }
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,local_210._8_8_);
          if ((char *)local_210._8_8_ != local_200._M_local_buf + 8) {
            operator_delete((void *)local_210._8_8_,local_200._8_8_ + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
        ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      }
      goto LAB_004690c6;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
               ,0x54);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"srgb_8bit_to_linear_8bit",0x18);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x227);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_1d0 = local_1c0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d0,"channel_stride {} is smaller than input channels {}","");
    fmt::format<unsigned_long,unsigned_long>
              ((string *)(local_210 + 8),(fmt *)&local_1d0,(string *)local_210,
               (unsigned_long *)&local_1e8,(unsigned_long *)channel_stride);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_210._8_8_,local_200._M_allocated_capacity
                       );
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((char *)local_210._8_8_ != local_200._M_local_buf + 8) {
      operator_delete((void *)local_210._8_8_,local_200._8_8_ + 1);
    }
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,local_210._8_8_);
      if ((char *)local_210._8_8_ == local_200._M_local_buf + 8) goto LAB_004690a6;
      goto LAB_00469099;
    }
  }
LAB_004690a6:
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  uVar7 = 0;
LAB_004690c6:
  return (bool)(char)uVar7;
}

Assistant:

bool srgb_8bit_to_linear_8bit(const std::vector<uint8_t> &in_img, size_t width,
                         size_t height,
                         size_t channels, size_t channel_stride,
                         std::vector<uint8_t> *out_img, std::string *err) {

  if (width == 0) {
    PUSH_ERROR_AND_RETURN("width is zero.");
  }

  if (height == 0) {
    PUSH_ERROR_AND_RETURN("height is zero.");
  }

  if (channels == 0) {
    PUSH_ERROR_AND_RETURN("channels is zero.");
  }

  if (out_img == nullptr) {
    PUSH_ERROR_AND_RETURN("`out_img` is nullptr.");
  }

  if (channel_stride == 0) {
    channel_stride = channels;
  } else {
    if (channel_stride < channels) {
      PUSH_ERROR_AND_RETURN(fmt::format("channel_stride {} is smaller than input channels {}", channel_stride, channels));
    }
  }

  size_t dest_size = size_t(width) * size_t(height) * channel_stride;
  if (dest_size > in_img.size()) {
    PUSH_ERROR_AND_RETURN(fmt::format("Insufficient input buffer size. must be the same or larger than {} but has {}", dest_size, in_img.size()));
  }

  out_img->resize(dest_size);

  // TODO: Precompute table.
  uint8_t linearlization_table[256];
  for (size_t u = 0; u < 256; u++) {
    float f = float(u) / 255.0f;
    linearlization_table[u] = detail::f32_to_u8(SrgbTransform::srgbToLinear(f));
  }

  for (size_t y = 0; y < height; y++) {
    for (size_t x = 0; x < width; x++) {
      for (size_t c = 0; c < channels; c++) {
        size_t idx = channel_stride * width * y + channel_stride * x + c;
        (*out_img)[idx] = linearlization_table[in_img[idx]];
      }

      // remainder(usually alpha channel)
      // no op.
      for (size_t c = channels; c < channel_stride; c++) {
        size_t idx = channel_stride * width * y + channel_stride * x + c;
        (*out_img)[idx] = in_img[idx];
      }
    }
  }

  return true;
}